

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisDecodeSIB(ZydisDecodedInstruction *instruction,ZyanU8 data)

{
  ZyanU8 data_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2bf,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
  }
  if ((instruction->attributes & 1) == 0) {
    __assert_fail("instruction->attributes & (1ULL << 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
  }
  if ((instruction->raw).modrm.rm != '\x04') {
    __assert_fail("instruction->raw.modrm.rm == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2c1,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
  }
  if ((instruction->attributes & 2) == 0) {
    if ((uint)(instruction->raw).sib.offset == instruction->length - 1) {
      instruction->attributes = instruction->attributes | 2;
      (instruction->raw).sib.scale = (ZyanU8)((int)(uint)data >> 6);
      (instruction->raw).sib.index = (byte)((int)(uint)data >> 3) & 7;
      (instruction->raw).sib.base = data & 7;
      return;
    }
    __assert_fail("instruction->raw.sib.offset == instruction->length - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2c3,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
  }
  __assert_fail("!(instruction->attributes & (1ULL << 1))",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
}

Assistant:

static void ZydisDecodeSIB(ZydisDecodedInstruction* instruction, ZyanU8 data)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MODRM);
    ZYAN_ASSERT(instruction->raw.modrm.rm == 4);
    ZYAN_ASSERT(!(instruction->attributes & ZYDIS_ATTRIB_HAS_SIB));
    ZYAN_ASSERT(instruction->raw.sib.offset == instruction->length - 1);

    instruction->attributes    |= ZYDIS_ATTRIB_HAS_SIB;
    instruction->raw.sib.scale = (data >> 6) & 0x03;
    instruction->raw.sib.index = (data >> 3) & 0x07;
    instruction->raw.sib.base  = (data >> 0) & 0x07;
}